

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CustomReporter.cpp
# Opt level: O0

shared_ptr<ApprovalTests::GenericDiffReporter>
ApprovalTests::CustomReporter::create(string *path,string *arguments,Type type)

{
  string *in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  string *in_RSI;
  element_type *in_RDI;
  shared_ptr<ApprovalTests::GenericDiffReporter> sVar1;
  DiffInfo info;
  element_type *peVar2;
  string *program_;
  DiffInfo *this;
  DiffInfo *in_stack_ffffffffffffff48;
  undefined1 local_a8 [32];
  string local_88 [4];
  
  program_ = (string *)(local_a8 + 0x20);
  peVar2 = in_RDI;
  ::std::__cxx11::string::string((string *)program_,in_RSI);
  this = (DiffInfo *)local_a8;
  ::std::__cxx11::string::string((string *)this,(string *)in_RDX);
  DiffInfo::DiffInfo(this,program_,in_RDX,(Type)((ulong)peVar2 >> 0x20));
  ::std::__cxx11::string::~string((string *)local_a8);
  ::std::__cxx11::string::~string((string *)(local_a8 + 0x20));
  ::std::make_shared<ApprovalTests::GenericDiffReporter,ApprovalTests::DiffInfo&>
            (in_stack_ffffffffffffff48);
  DiffInfo::~DiffInfo((DiffInfo *)in_RDI);
  sVar1.super___shared_ptr<ApprovalTests::GenericDiffReporter,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = extraout_RDX._M_pi;
  sVar1.super___shared_ptr<ApprovalTests::GenericDiffReporter,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       peVar2;
  return (shared_ptr<ApprovalTests::GenericDiffReporter>)
         sVar1.super___shared_ptr<ApprovalTests::GenericDiffReporter,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<GenericDiffReporter>
    CustomReporter::create(std::string path, std::string arguments, Type type)
    {
        DiffInfo info(std::move(path), std::move(arguments), type);
        return std::make_shared<GenericDiffReporter>(info);
    }